

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O3

Lit __thiscall Minisat::Clause::subsumes(Clause *this,Clause *other)

{
  anon_struct_4_5_613047fb_for_header aVar1;
  anon_struct_4_5_613047fb_for_header aVar2;
  anon_struct_4_5_613047fb_for_header aVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  
  aVar1 = this->header;
  if (((uint)aVar1 & 4) == 0) {
    aVar2 = other->header;
    if (((uint)aVar2 & 4) == 0) {
      if (((uint)aVar1 & 8) == 0) {
        pcVar6 = "header.has_extra";
      }
      else {
        if (((uint)aVar2 & 8) != 0) {
          uVar4 = (uint)aVar2 >> 5;
          uVar5 = (uint)aVar1 >> 5;
          if ((uVar5 <= uVar4) &&
             (((uint)this[(ulong)uVar5 + 1].header & ~(uint)other[(ulong)uVar4 + 1].header) == 0)) {
            aVar3 = (anon_struct_4_5_613047fb_for_header)0xfffffffe;
            if ((uint)aVar1 < 0x20) {
              return (Lit)-2;
            }
            if (0x1f < (uint)aVar2) {
              uVar7 = 0;
              do {
                aVar1 = this[uVar7 + 1].header;
                uVar8 = 0;
                while ((aVar2 = aVar3, aVar1 != other[uVar8 + 1].header &&
                       ((aVar3 != (anon_struct_4_5_613047fb_for_header)0xfffffffe ||
                        (aVar2 = aVar1, ((uint)other[uVar8 + 1].header ^ (uint)aVar1) != 1))))) {
                  uVar8 = uVar8 + 1;
                  if (uVar4 == uVar8) {
                    return (Lit)-1;
                  }
                }
                aVar3 = aVar2;
                uVar7 = uVar7 + 1;
              } while (uVar7 != uVar5);
              return (Lit)(int)aVar3;
            }
          }
          return (Lit)-1;
        }
        pcVar6 = "other.header.has_extra";
      }
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/core/SolverTypes.h"
                    ,0x1bb,"Lit Minisat::Clause::subsumes(const Clause &) const");
    }
    pcVar6 = "!other.header.learnt";
  }
  else {
    pcVar6 = "!header.learnt";
  }
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/core/SolverTypes.h"
                ,0x1ba,"Lit Minisat::Clause::subsumes(const Clause &) const");
}

Assistant:

inline Lit Clause::subsumes(const Clause& other) const
{
    //if (other.size() < size() || (extra.abst & ~other.extra.abst) != 0)
    //if (other.size() < size() || (!learnt() && !other.learnt() && (extra.abst & ~other.extra.abst) != 0))
    assert(!header.learnt);   assert(!other.header.learnt);
    assert(header.has_extra); assert(other.header.has_extra);
    if (other.header.size < header.size || (data[header.size].abs & ~other.data[other.header.size].abs) != 0)
        return lit_Error;

    Lit        ret = lit_Undef;
    const Lit* c   = (const Lit*)(*this);
    const Lit* d   = (const Lit*)other;

    for (unsigned i = 0; i < header.size; i++) {
        // search for c[i] or ~c[i]
        for (unsigned j = 0; j < other.header.size; j++)
            if (c[i] == d[j])
                goto ok;
            else if (ret == lit_Undef && c[i] == ~d[j]){
                ret = c[i];
                goto ok;
            }

        // did not find it
        return lit_Error;
    ok:;
    }

    return ret;
}